

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::Ok> *
wasm::WATParser::makeStructGet<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool signed_)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
  *p_Var3;
  HeapTypeT type_00;
  undefined1 local_d0 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> type;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined8 uStack_90;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *local_88;
  undefined1 local_80 [8];
  Result<unsigned_int> field;
  Result<unsigned_int> _val_1;
  
  local_88 = annotations;
  typeidx<wasm::WATParser::ParseDefsCtx>
            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
             local_d0,ctx);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     *)local_80,
                    (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     *)local_d0);
  if (field.val.super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_ == '\x01') {
    puVar1 = (undefined1 *)
             ((long)&_val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 8);
    field.val.super__Variant_base<unsigned_int,_wasm::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::Err>.super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
               CONCAT44(local_80._4_4_,local_80._0_4_),
               field.val.super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._0_8_ +
               CONCAT44(local_80._4_4_,local_80._0_4_));
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
    if ((undefined1 *)
        field.val.super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ == puVar1) {
      *puVar2 = CONCAT71(_val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._9_7_,
                         _val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           _val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
           super__Move_assign_alias<unsigned_int,_wasm::Err>.
           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
           super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
           super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
           field.val.super__Variant_base<unsigned_int,_wasm::Err>.
           super__Move_assign_alias<unsigned_int,_wasm::Err>.
           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
           super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
           super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           CONCAT71(_val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
                    super__Move_assign_alias<unsigned_int,_wasm::Err>.
                    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                    super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                    super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                    super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._9_7_,
                    _val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
                    super__Move_assign_alias<unsigned_int,_wasm::Err>.
                    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                    super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                    super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                    super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._8_1_);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
         _val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
         super__Move_assign_alias<unsigned_int,_wasm::Err>.
         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
         super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
         super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._0_8_;
    _val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::Err>.super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._0_8_ = 0;
    _val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::Err>.super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    field.val.super__Variant_base<unsigned_int,_wasm::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::Err>.super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = puVar1;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         *)local_80);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         *)local_80);
    p_Var3 = (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
              *)0x0;
    if (type.val.
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        ._M_u._24_1_ == '\0') {
      p_Var3 = (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                *)local_d0;
    }
    type_00.exactness =
         *(undefined4 *)
          ((long)&(p_Var3->
                  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                  )._M_u + 8);
    type_00.type.id = (uintptr_t)local_d0;
    type_00._12_4_ = 0;
    fieldidx<wasm::WATParser::ParseDefsCtx>((Result<unsigned_int> *)local_80,ctx,type_00);
    std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)
               ((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
               (_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_80);
    if (_val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_ == '\x01') {
      type.val.
      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      ._32_8_ = &local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&type.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                 + 0x20),field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_,
                 _val_1.val.super__Variant_base<unsigned_int,_wasm::Err>.
                 super__Move_assign_alias<unsigned_int,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._0_8_ +
                 field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                 super__Move_assign_alias<unsigned_int,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
      if ((undefined1 *)
          type.val.
          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          ._32_8_ == &local_98) {
        *puVar2 = CONCAT71(uStack_97,local_98);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_90;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
             type.val.
             super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
             ._32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             CONCAT71(uStack_97,local_98);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_a0;
      local_98 = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      type.val.
      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
      ._32_8_ = &local_98;
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
                 ((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
                 ((long)&field.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
      ParseDefsCtx::makeStructGet
                (__return_storage_ptr__,ctx,pos,local_88,(HeapType)local_d0,local_80._0_4_,signed_,
                 Unordered);
    }
    std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_80);
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeStructGet(Ctx& ctx,
                       Index pos,
                       const std::vector<Annotation>& annotations,
                       bool signed_) {
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  auto field = fieldidx(ctx, *type);
  CHECK_ERR(field);
  return ctx.makeStructGet(
    pos, annotations, *type, *field, signed_, MemoryOrder::Unordered);
}